

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::ComputeRecursiveEntryPoints(ValidationState_t *this)

{
  size_t *this_00;
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *this_01;
  reference this_02;
  reference pvVar4;
  mapped_type *this_03;
  reference puVar5;
  Function *this_04;
  reference puVar6;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar7;
  uint local_1a4;
  iterator iStack_1a0;
  uint32_t new_call_1;
  iterator __end5_1;
  iterator __begin5_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range5_1;
  Function *called_func;
  uint local_13c;
  iterator iStack_138;
  uint32_t entry_point;
  iterator __end5;
  iterator __begin5;
  mapped_type *__range5;
  uint32_t local_100;
  uint local_fc;
  uint32_t called_func_id;
  uint32_t new_call;
  iterator __end3;
  iterator __begin3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> call_stack;
  Function *func;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *__range2;
  ValidationState_t *this_local;
  
  this_01 = functions(this);
  __end2 = std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::begin
                     (this_01);
  func = (Function *)
         std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::end
                   (this_01);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
                                *)&func);
    if (!bVar2) {
      return;
    }
    this_02 = __gnu_cxx::
              __normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
              ::operator*(&__end2);
    std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
    stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
              ((stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)
               &visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &__range3);
    Function::function_call_targets
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &__begin3,this_02);
    __end3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&__begin3);
    _called_func_id =
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &__begin3);
    while (bVar2 = std::operator!=(&__end3,(_Self *)&called_func_id), bVar2) {
      puVar6 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end3);
      local_fc = *puVar6;
      std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &visited._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_fc);
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end3);
    }
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &__begin3);
LAB_002669e2:
    do {
      bVar2 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
              empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *
                    )&visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_00266c06;
      this_00 = &visited._M_t._M_impl.super__Rb_tree_header._M_node_count;
      pvVar4 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
               top((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   this_00);
      local_100 = *pvVar4;
      std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 this_00);
      pVar7 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&__range3,&local_100);
      uVar1 = local_100;
    } while (((pVar7.second ^ 0xffU) & 1) != 0);
    uVar3 = Function::id(this_02);
    if (uVar1 != uVar3) {
      this_04 = function(this,local_100);
      if (this_04 != (Function *)0x0) {
        Function::function_call_targets
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &__begin5_1,this_04);
        __end5_1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&__begin5_1);
        iStack_1a0 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&__begin5_1);
        while (bVar2 = std::operator!=(&__end5_1,&stack0xfffffffffffffe60), bVar2) {
          puVar6 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end5_1);
          local_1a4 = *puVar6;
          std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                    ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_1a4);
          std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end5_1);
        }
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &__begin5_1);
      }
      goto LAB_002669e2;
    }
    this_03 = std::
              unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->function_to_entry_points_,&local_100);
    __end5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_03);
    iStack_138 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_03);
    while (bVar2 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffffec8), bVar2) {
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end5);
      local_13c = *puVar5;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                (&this->recursive_entry_points_,&local_13c);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end5);
    }
LAB_00266c06:
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &__range3);
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~stack
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __gnu_cxx::
    __normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void ValidationState_t::ComputeRecursiveEntryPoints() {
  for (const Function& func : functions()) {
    std::stack<uint32_t> call_stack;
    std::set<uint32_t> visited;

    for (const uint32_t new_call : func.function_call_targets()) {
      call_stack.push(new_call);
    }

    while (!call_stack.empty()) {
      const uint32_t called_func_id = call_stack.top();
      call_stack.pop();

      if (!visited.insert(called_func_id).second) continue;

      if (called_func_id == func.id()) {
        for (const uint32_t entry_point :
             function_to_entry_points_[called_func_id])
          recursive_entry_points_.insert(entry_point);
        break;
      }

      const Function* called_func = function(called_func_id);
      if (called_func) {
        // Other checks should error out on this invalid SPIR-V.
        for (const uint32_t new_call : called_func->function_call_targets()) {
          call_stack.push(new_call);
        }
      }
    }
  }
}